

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void __thiscall
obx::Tree::putAsync(Tree *this,char *path,void *data,size_t size,OBXPropertyType type,void *metadata
                   ,size_t metadata_size,OBXPutMode dataPutMode,
                   function<void_(const_obx::AsyncTreePutResult_&)> *callback)

{
  bool bVar1;
  obx_err err_00;
  code *pcVar2;
  function<void_(const_obx::AsyncTreePutResult_&)> *local_88;
  obx_err err;
  obx_tree_async_put_callback *cCallback;
  function<void_(const_obx::AsyncTreePutResult_&)> *funPtr;
  bool hasCallback;
  void *metadata_local;
  OBXPropertyType type_local;
  size_t size_local;
  void *data_local;
  char *path_local;
  Tree *this_local;
  
  bVar1 = std::operator!=(callback,(nullptr_t)0x0);
  if (bVar1) {
    local_88 = (function<void_(const_obx::AsyncTreePutResult_&)> *)operator_new(0x20);
    std::function<void_(const_obx::AsyncTreePutResult_&)>::function(local_88,callback);
  }
  else {
    local_88 = (function<void_(const_obx::AsyncTreePutResult_&)> *)0x0;
  }
  pcVar2 = (code *)0x0;
  if (bVar1) {
    pcVar2 = anon_unknown_3::cCallbackTrampolineAsyncTreePut;
  }
  err_00 = obx_tree_async_put_raw
                     (*(undefined8 *)this,path,data,size,type,metadata,metadata_size,dataPutMode,
                      pcVar2,local_88);
  internal::checkErrOrThrow(err_00);
  return;
}

Assistant:

void Tree::putAsync(const char* path, void* data, size_t size, OBXPropertyType type, void* metadata,
                    size_t metadata_size, OBXPutMode dataPutMode,
                    std::function<void(const AsyncTreePutResult& result)> callback) {
    bool hasCallback = callback != nullptr;
    auto funPtr = hasCallback ? new std::function<void(const AsyncTreePutResult&)>(std::move(callback)) : nullptr;
    obx_tree_async_put_callback* cCallback = hasCallback ? cCallbackTrampolineAsyncTreePut : nullptr;
    obx_err err =
        obx_tree_async_put_raw(cTree_, path, data, size, type, metadata, metadata_size, dataPutMode, cCallback, funPtr);
    internal::checkErrOrThrow(err);
}